

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O2

void __thiscall
wigwag::detail::
signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
::invoke<CollectionOp&,int_const&,std::__cxx11::string_const&>
          (signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
           *this,CollectionOp *args,int *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
  *psVar1;
  iterator tmp;
  signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
  *psVar2;
  signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
  *psVar3;
  bool bVar4;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_signal_impl_hpp:93:45)>
  sg;
  execution_guard g;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_signal_impl_hpp:93:45)>
  local_58;
  execution_guard local_48;
  
  threading::shared_recursive_mutex::lock_primitive::lock_recursive((lock_primitive *)(this + 0x70))
  ;
  local_58._moved = false;
  psVar1 = *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
             **)(this + 0xa0);
  local_58._f.this =
       (signal_impl<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
        *)this;
  if (this + 0xa0 != psVar1 ||
      *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
        **)(this + 0xa8) != this + 0xa0) {
    psVar2 = *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
               **)(this + 0xa8);
    do {
      if (*(int *)(psVar2 + -4) == 1) {
        psVar3 = *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
                   **)(psVar2 + 8);
        listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
        ::handler_node::finalize_node((handler_node *)(psVar2 + -0x18));
      }
      else {
        life_assurance::intrusive_life_tokens::execution_guard::execution_guard
                  (&local_48,(shared_data *)(this + 0x18),(life_assurance *)(psVar2 + -0x10));
        if (local_48._alive != 0) {
          exception_handling::print_to_stderr::
          handle_exceptions<std::function<void(CollectionOp,int_const&,std::__cxx11::string_const&)>&,CollectionOp&,int_const&,std::__cxx11::string_const&>
                    ((print_to_stderr *)(this + 8),
                     (function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)(psVar2 + 0x18),args,args_1,args_2);
        }
        psVar3 = *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
                   **)(psVar2 + 8);
        life_assurance::intrusive_life_tokens::execution_guard::~execution_guard(&local_48);
      }
      bVar4 = psVar2 != psVar1;
      psVar2 = psVar3;
    } while (bVar4);
  }
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/include/wigwag/detail/signal_impl.hpp:93:45)>
  ::~scope_guard(&local_58);
  return;
}

Assistant:

void invoke(Args_&&... args)
        {
            this->get_lock_primitive().lock_recursive();
            auto sg = detail::at_scope_exit([&] { this->get_lock_primitive().unlock_recursive(); } );

            if (this->_handlers.empty())
                return;
            auto it = this->_handlers.begin(), e = this->_handlers.pre_end();

            bool last_iter = false;
            while (!last_iter)
            {
                last_iter = it == e;

                if (it->should_be_finalized())
                {
                    (it++)->finalize_node();
                    continue;
                }

                execution_guard g(listenable_base::get_life_assurance_shared_data(), it->get_life_assurance());
                if (g.is_alive())
                    this->get_exception_handler().handle_exceptions(it->get_handler(), std::forward<Args_>(args)...);
                ++it;
            }
        }